

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O2

int process_bits(byte_t *input_buffer,FILE *output_file_ptr)

{
  _Bool _Var1;
  int iVar2;
  adh_node_t *paVar3;
  int iVar4;
  
  paVar3 = get_nyt();
  _Var1 = compare_input_and_nyt(input_buffer,in_bit_idx,last_bit_idx,&paVar3->bit_array);
  iVar4 = 1;
  if (_Var1) {
    iVar2 = skip_nyt_bits((uint)(paVar3->bit_array).length);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = decode_new_symbol(input_buffer);
    if (iVar2 != 0) {
      return 1;
    }
  }
  else {
    iVar2 = decode_existing_symbol(input_buffer);
    if (iVar2 == 1) {
      return 1;
    }
  }
  if ((output_byte_idx != 0x3ff) || (iVar2 = flush_uncompressed(output_file_ptr), iVar2 == 0)) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int process_bits(const byte_t *input_buffer, FILE *output_file_ptr) {
    int rc;
    adh_node_t* nyt = get_nyt();
    bool is_nyt_code = compare_input_and_nyt(input_buffer, in_bit_idx, last_bit_idx, &(nyt->bit_array));
    if(is_nyt_code) {
        rc = skip_nyt_bits(nyt->bit_array.length);
        if(rc == RC_FAIL) return rc;

        rc = decode_new_symbol(input_buffer);
        if(rc == RC_FAIL) return rc;
    } else {
        rc = decode_existing_symbol(input_buffer);
        if(rc == RC_FAIL) return rc;
    }

    if(output_byte_idx == BUFFER_SIZE -1) {
        rc = flush_uncompressed(output_file_ptr);
        if(rc == RC_FAIL) return rc;
    }
    return RC_OK;
}